

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O3

int DSA_SIG_set0(DSA_SIG *sig,BIGNUM *r,BIGNUM *s)

{
  if (s != (BIGNUM *)0x0 && r != (BIGNUM *)0x0) {
    BN_free((BIGNUM *)sig->r);
    BN_free((BIGNUM *)sig->s);
    sig->r = r;
    sig->s = s;
  }
  return (uint)(s != (BIGNUM *)0x0 && r != (BIGNUM *)0x0);
}

Assistant:

int DSA_SIG_set0(DSA_SIG *sig, BIGNUM *r, BIGNUM *s) {
  if (r == NULL || s == NULL) {
    return 0;
  }
  BN_free(sig->r);
  BN_free(sig->s);
  sig->r = r;
  sig->s = s;
  return 1;
}